

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

Dialog * __thiscall Quest_Context::GetDialog(Quest_Context *this,short id)

{
  undefined2 uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  if (((this->quest->quest->info).disabled == false) &&
     (p_Var2 = (this->dialogs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var2 != (_Base_ptr)0x0)) {
    p_Var4 = &(this->dialogs)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var4->_M_header;
    do {
      uVar1 = (undefined2)p_Var2[1]._M_color;
      if (id <= (short)uVar1) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(short)uVar1 < id];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var4) && ((short)p_Var3[1]._M_color <= id)) {
      return (Dialog *)p_Var3[1]._M_parent;
    }
  }
  return (Dialog *)0x0;
}

Assistant:

const Dialog* Quest_Context::GetDialog(short id) const
{
	if (this->quest->Disabled())
		return 0;

	auto it = this->dialogs.find(id);

	if (it == this->dialogs.end())
		return 0;

	// WARNING: returns a non-tracked reference to shared_ptr
	return it->second.get();
}